

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_se.c
# Opt level: O0

int h264_sub_mb_type(bitstream *str,h264_cabac_context *cabac,uint32_t slice_type,uint32_t *val)

{
  int iVar1;
  int local_58 [2];
  int bidx_1 [4];
  int bidx [3];
  uint32_t tmp;
  int rend;
  int rbase;
  uint32_t *val_local;
  uint32_t slice_type_local;
  h264_cabac_context *cabac_local;
  bitstream *str_local;
  
  if (cabac != (h264_cabac_context *)0x0) {
    if ((slice_type != 0) && (slice_type != 3)) {
      if (slice_type == 1) {
        local_58[0] = 0x24;
        local_58[1] = 0x25;
        bidx_1[0] = 0x26;
        bidx_1[1] = 0x27;
        iVar1 = h264_cabac_se(str,cabac,sub_mb_type_b,local_58,val);
        return iVar1;
      }
      fprintf(_stderr,"sub_mb_type requested for invalid slice type\n");
      return 1;
    }
    bidx_1[2] = 0x15;
    bidx_1[3] = 0x16;
    bidx[0] = 0x17;
    iVar1 = h264_cabac_se(str,cabac,sub_mb_type_p,bidx_1 + 2,val);
    return iVar1;
  }
  bidx[2] = 0;
  if (slice_type != 0) {
    if (slice_type == 1) {
      tmp = 4;
      bidx[2] = 0x11;
      goto LAB_0010e504;
    }
    if (slice_type != 3) {
      fprintf(_stderr,"sub_mb_type requested for invalid slice type\n");
      return 1;
    }
  }
  tmp = 0;
  bidx[2] = 4;
LAB_0010e504:
  bidx[1] = *val - tmp;
  iVar1 = vs_ue(str,(uint32_t *)(bidx + 1));
  if (iVar1 == 0) {
    *val = bidx[1] + tmp;
    if ((*val < tmp) || ((uint)bidx[2] <= *val)) {
      fprintf(_stderr,"Invalid sub_mb_type for this slice_type\n");
      str_local._4_4_ = 1;
    }
    else {
      str_local._4_4_ = 0;
    }
  }
  else {
    str_local._4_4_ = 1;
  }
  return str_local._4_4_;
}

Assistant:

int h264_sub_mb_type(struct bitstream *str, struct h264_cabac_context *cabac, uint32_t slice_type, uint32_t *val) {
	if (!cabac) {
		int rbase = 0, rend = 0;
		switch (slice_type) {
			case H264_SLICE_TYPE_P:
			case H264_SLICE_TYPE_SP:
				rbase = H264_SUB_MB_TYPE_P_BASE;
				rend = H264_SUB_MB_TYPE_P_END;
				break;
			case H264_SLICE_TYPE_B:
				rbase = H264_SUB_MB_TYPE_B_BASE;
				rend = H264_SUB_MB_TYPE_B_END;
				break;
			default:
				fprintf(stderr, "sub_mb_type requested for invalid slice type\n");
				return 1;
		}
		uint32_t tmp = *val - rbase;
		if (vs_ue(str, &tmp))
			return 1;
		*val = tmp + rbase;
		if (*val < rbase || *val >= rend) {
			fprintf(stderr, "Invalid sub_mb_type for this slice_type\n");
			return 1;
		}
		return 0;
	} else {
		if (slice_type == H264_SLICE_TYPE_P || slice_type == H264_SLICE_TYPE_SP) {
			int bidx[3] = {
				H264_CABAC_CTXIDX_SUB_MB_TYPE_P + 0,
				H264_CABAC_CTXIDX_SUB_MB_TYPE_P + 1,
				H264_CABAC_CTXIDX_SUB_MB_TYPE_P + 2,
			};
			return h264_cabac_se(str, cabac, sub_mb_type_p, bidx, val);
		} else if (slice_type == H264_SLICE_TYPE_B) {
			int bidx[4] = {
				H264_CABAC_CTXIDX_SUB_MB_TYPE_B + 0,
				H264_CABAC_CTXIDX_SUB_MB_TYPE_B + 1,
				H264_CABAC_CTXIDX_SUB_MB_TYPE_B + 2,
				H264_CABAC_CTXIDX_SUB_MB_TYPE_B + 3,
			};
			return h264_cabac_se(str, cabac, sub_mb_type_b, bidx, val);
		} else {
			fprintf(stderr, "sub_mb_type requested for invalid slice type\n");
			return 1;
		}
	}
}